

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O2

void __thiscall mjs::function_object::fixup(function_object *this)

{
  gc_heap *old_heap;
  
  old_heap = (this->super_native_object).super_object.heap_;
  gc_heap_ptr_untracked<mjs::global_object,_true>::fixup
            ((gc_heap_ptr_untracked<mjs::global_object,_true> *)
             &(this->super_native_object).field_0x24,old_heap);
  gc_heap_ptr_untracked<mjs::gc_function,_true>::fixup(&this->construct_,old_heap);
  gc_heap_ptr_untracked<mjs::gc_function,_true>::fixup(&this->call_,old_heap);
  gc_heap_ptr_untracked<mjs::gc_string,_true>::fixup(&this->text_,old_heap);
  value_representation::fixup(&this->prototype_prop_,old_heap);
  native_object::fixup(&this->super_native_object);
  return;
}

Assistant:

void function_object::fixup() {
    auto& h = heap();
    global_.fixup(h);
    construct_.fixup(h);
    call_.fixup(h);
    text_.fixup(h);
    prototype_prop_.fixup(h);
    native_object::fixup();
}